

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

unsigned_long
ReadVarInt<HashVerifier<AutoFile>,(VarIntMode)0,unsigned_long>(HashVerifier<AutoFile> *is)

{
  CSHA256 *pCVar1;
  ulong uVar2;
  char *pcVar3;
  size_t in_RCX;
  int __fd;
  long lVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  uchar local_40 [8];
  undefined8 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  __fd = (int)local_40;
  AutoFile::read(is->m_source,__fd,(void *)0x1,in_RCX);
  pCVar1 = CSHA256::Write((CSHA256 *)is,local_40,1);
  uVar2 = CONCAT71((int7)((ulong)pCVar1 >> 8),local_40[0]);
  lVar4 = 0;
  while( true ) {
    uVar5 = uVar2 & 0x7f | lVar4 << 7;
    if (-1 < (char)uVar2) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        return uVar5;
      }
      goto LAB_0021e19b;
    }
    if (uVar5 == 0xffffffffffffffff) break;
    lVar4 = uVar5 + 1;
    AutoFile::read(is->m_source,__fd,(void *)0x1,uVar2 & 0xffffff7f);
    pCVar1 = CSHA256::Write((CSHA256 *)is,local_40,1);
    uVar2 = CONCAT71((int7)((ulong)pCVar1 >> 8),local_40[0]);
    if (0x1fffffffffffffe < uVar5) {
      pcVar3 = (char *)__cxa_allocate_exception(0x20);
      local_38 = std::iostream_category();
      local_40[0] = '\x01';
      local_40[1] = '\0';
      local_40[2] = '\0';
      local_40[3] = '\0';
      std::ios_base::failure[abi:cxx11]::failure
                (pcVar3,(error_code *)"ReadVarInt(): size too large");
LAB_0021e148:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        __cxa_throw(pcVar3,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
LAB_0021e19b:
      __stack_chk_fail();
    }
  }
  pcVar3 = (char *)__cxa_allocate_exception(0x20);
  local_38 = std::iostream_category();
  local_40[0] = '\x01';
  local_40[1] = '\0';
  local_40[2] = '\0';
  local_40[3] = '\0';
  std::ios_base::failure[abi:cxx11]::failure(pcVar3,(error_code *)"ReadVarInt(): size too large");
  goto LAB_0021e148;
}

Assistant:

I ReadVarInt(Stream& is)
{
    CheckVarIntMode<Mode, I>();
    I n = 0;
    while(true) {
        unsigned char chData = ser_readdata8(is);
        if (n > (std::numeric_limits<I>::max() >> 7)) {
           throw std::ios_base::failure("ReadVarInt(): size too large");
        }
        n = (n << 7) | (chData & 0x7F);
        if (chData & 0x80) {
            if (n == std::numeric_limits<I>::max()) {
                throw std::ios_base::failure("ReadVarInt(): size too large");
            }
            n++;
        } else {
            return n;
        }
    }
}